

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

cupdlp_int csc2csr(CUPDLPcsr *csr,CUPDLPcsc *csc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  cupdlp_dcs *A;
  cupdlp_dcs *A_00;
  
  A = cupdlp_dcs_spalloc(csc->nRows,csc->nCols,csc->nMatElem,1,0);
  memcpy(A->p,csc->colMatBeg,(long)csc->nCols * 4 + 4);
  memcpy(A->i,csc->colMatIdx,(long)csc->nMatElem << 2);
  memcpy(A->x,csc->colMatElem,(long)csc->nMatElem << 3);
  A_00 = cupdlp_dcs_transpose(A,1);
  iVar3 = A_00->n;
  csr->nRows = iVar3;
  uVar1 = A_00->nzmax;
  uVar2 = A_00->m;
  csr->nCols = uVar2;
  csr->nMatElem = uVar1;
  memcpy(csr->rowMatBeg,A_00->p,(long)iVar3 * 4 + 4);
  memcpy(csr->rowMatIdx,A_00->i,(long)A_00->nzmax << 2);
  memcpy(csr->rowMatElem,A_00->x,(long)A_00->nzmax << 3);
  cupdlp_dcs_spfree(A);
  cupdlp_dcs_spfree(A_00);
  return 0;
}

Assistant:

cupdlp_int csc2csr(CUPDLPcsr *csr, CUPDLPcsc *csc) {
  // The transpose may need to be done on the GPU
  // Currently, it is done on the CPU

  cupdlp_dcs *cs_csc =
      cupdlp_dcs_spalloc(csc->nRows, csc->nCols, csc->nMatElem, 1, 0);
  cupdlp_copy(cs_csc->p, csc->colMatBeg, cupdlp_int, csc->nCols + 1);
  cupdlp_copy(cs_csc->i, csc->colMatIdx, cupdlp_int, csc->nMatElem);
  cupdlp_copy(cs_csc->x, csc->colMatElem, cupdlp_float, csc->nMatElem);

  cupdlp_dcs *cs_csr = cupdlp_dcs_transpose(cs_csc, 1);
  csr->nCols = cs_csr->m;
  csr->nRows = cs_csr->n;
  csr->nMatElem = cs_csr->nzmax;
  CUPDLP_COPY_VEC(csr->rowMatBeg, cs_csr->p, cupdlp_int, cs_csr->n + 1);
  CUPDLP_COPY_VEC(csr->rowMatIdx, cs_csr->i, cupdlp_int, cs_csr->nzmax);
  CUPDLP_COPY_VEC(csr->rowMatElem, cs_csr->x, cupdlp_float, cs_csr->nzmax);

  // cupdlp_dcs_free(cs_csc);
  // cupdlp_dcs_free(cs_csr);
  cupdlp_dcs_spfree(cs_csc);
  cupdlp_dcs_spfree(cs_csr);

#ifndef CUPDLP_CPU
  // Pointer to GPU csc matrix
  CHECK_CUSPARSE(cusparseCreateCsr(
      &csr->cuda_csr, csr->nRows, csr->nCols, csr->nMatElem, csr->rowMatBeg,
      csr->rowMatIdx, csr->rowMatElem, CUSPARSE_INDEX_32I, CUSPARSE_INDEX_32I,
      CUSPARSE_INDEX_BASE_ZERO, CudaComputeType));
#endif

  return 0;
}